

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

wchar_t archive_entry_update_symlink_utf8(archive_entry *entry,char *linkname)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  
  if ((linkname != (char *)0x0) || ((entry->ae_set & L'\x01') == L'\0')) {
    wVar1 = entry->ae_set & 0xfffffffc;
    wVar2 = wVar1 + L'\x02';
    if (linkname == (char *)0x0) {
      wVar2 = wVar1;
    }
    entry->ae_set = wVar2;
    wVar2 = archive_mstring_update_utf8(entry->archive,&entry->ae_linkname,linkname);
    if (wVar2 == L'\0') {
      return L'\x01';
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return L'\0';
}

Assistant:

int
archive_entry_update_symlink_utf8(struct archive_entry *entry, const char *linkname)
{
	if (linkname == NULL && (entry->ae_set & AE_SET_HARDLINK))
		return (0);
	entry->ae_set &= ~AE_SET_HARDLINK;
	if (linkname == NULL)
		entry->ae_set &= ~AE_SET_SYMLINK;
	else
		entry->ae_set |= AE_SET_SYMLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_linkname, linkname) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}